

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Parser::~Parser(Parser *this)

{
  Document *this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_Parser = (_func_int **)&PTR__Parser_00107d58;
  std::ifstream::close();
  this_00 = this->_document;
  if (this_00 != (Document *)0x0) {
    Document::~Document(this_00);
    operator_delete(this_00,0x38);
  }
  std::ifstream::~ifstream(&this->_input_file);
  pcVar1 = (this->_filename)._M_dataplus._M_p;
  paVar2 = &(this->_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Parser::~Parser() {
	_input_file.close();
	delete _document;
}